

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::write_response
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  Headers *this_00;
  pointer ppVar1;
  pointer ppVar2;
  string *this_01;
  bool bVar3;
  int iVar4;
  iterator __position;
  size_t sVar5;
  char *val;
  Response *content_length;
  char *pcVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  string length;
  string boundary;
  string content_type;
  undefined1 local_d8 [32];
  _Base_ptr local_b8;
  size_t local_b0;
  string *local_a8;
  Server *local_a0;
  Stream *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  allocator local_50 [32];
  
  iVar4 = res->status;
  if (iVar4 == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h"
                  ,0xb79,
                  "bool httplib::Server::write_response(Stream &, bool, const Request &, Response &)"
                 );
  }
  content_length = res;
  local_a0 = this;
  if ((399 < iVar4) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
              (&this->error_handler_,req,res);
    iVar4 = res->status;
  }
  local_d8._0_8_ = detail::status_message(iVar4);
  iVar4 = Stream::write_format<int,char_const*>
                    (strm,"HTTP/1.1 %d %s\r\n",&res->status,(char **)local_d8);
  if (iVar4 == 0) {
    return false;
  }
  if (last_connection) {
    pcVar6 = "close";
LAB_0011d456:
    Response::set_header(res,"Connection",pcVar6);
  }
  else {
    Request::get_header_value_abi_cxx11_((string *)local_d8,req,"Connection",0);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d8,"close");
    std::__cxx11::string::~string((string *)local_d8);
    if (bVar3) {
      Response::set_header(res,"Connection","close");
    }
    Request::get_header_value_abi_cxx11_((string *)local_d8,req,"Connection",0);
    pcVar6 = "Keep-Alive";
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d8,"Keep-Alive");
    std::__cxx11::string::~string((string *)local_d8);
    if (bVar3) goto LAB_0011d456;
  }
  bVar3 = Response::has_header(res,"Content-Type");
  if (!bVar3) {
    Response::set_header(res,"Content-Type","text/plain");
  }
  bVar3 = Response::has_header(res,"Accept-Ranges");
  if (!bVar3) {
    Response::set_header(res,"Accept-Ranges","bytes");
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  if (0x10 < (ulong)((long)(req->ranges).
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(req->ranges).
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    detail::make_multipart_data_boundary_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&local_90,(string *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::string((string *)local_d8,"Content-Type",local_50);
    this_00 = &res->headers;
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&this_00->_M_t,(key_type *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    if ((_Rb_tree_header *)__position._M_node != &(res->headers)._M_t._M_impl.super__Rb_tree_header)
    {
      std::__cxx11::string::_M_assign((string *)&local_70);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)this_00,__position);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   "multipart/byteranges; boundary=",&local_90);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[13],std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char (*) [13])"Content-Type",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
  }
  local_a8 = (string *)&res->body;
  sVar5 = (res->body)._M_string_length;
  if (sVar5 == 0) {
    sVar5 = res->content_length;
    if (sVar5 != 0) {
      ppVar1 = (req->ranges).
               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (req->ranges).
               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (ppVar1 != ppVar2) {
        if ((long)ppVar2 - (long)ppVar1 == 0x10) {
          pVar7 = detail::get_range_offset_and_length(req,sVar5,0);
          sVar5 = pVar7.second;
          detail::make_content_range_header_field_abi_cxx11_
                    ((string *)local_d8,(detail *)pVar7.first,sVar5,res->content_length,
                     (size_t)content_length);
          Response::set_header(res,"Content-Range",(string *)local_d8);
          std::__cxx11::string::~string((string *)local_d8);
        }
        else {
          sVar5 = detail::get_multipart_ranges_data_length(req,res,&local_90,&local_70);
        }
      }
      std::__cxx11::to_string((string *)local_d8,sVar5);
      Response::set_header(res,"Content-Length",(string *)local_d8);
      goto LAB_0011d777;
    }
    bVar3 = (res->content_provider).super__Function_base._M_manager == (_Manager_type)0x0;
    pcVar6 = "Transfer-Encoding";
    if (bVar3) {
      pcVar6 = "Content-Length";
    }
    val = "chunked";
    if (bVar3) {
      val = "0";
    }
    Response::set_header(res,pcVar6,val);
  }
  else {
    ppVar1 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (ppVar1 != ppVar2) {
      if ((long)ppVar2 - (long)ppVar1 == 0x10) {
        pVar7 = detail::get_range_offset_and_length(req,sVar5,0);
        detail::make_content_range_header_field_abi_cxx11_
                  ((string *)local_d8,(detail *)pVar7.first,pVar7.second,
                   (res->body)._M_string_length,(size_t)content_length);
        Response::set_header(res,"Content-Range",(string *)local_d8);
        this_01 = local_a8;
        local_98 = strm;
        std::__cxx11::string::substr((ulong)local_50,(ulong)local_a8);
        std::__cxx11::string::operator=(this_01,(string *)local_50);
        std::__cxx11::string::~string((string *)local_50);
        std::__cxx11::string::~string((string *)local_d8);
        strm = local_98;
      }
      else {
        detail::make_multipart_ranges_data((string *)local_d8,req,res,&local_90,&local_70);
        std::__cxx11::string::operator=(local_a8,(string *)local_d8);
        std::__cxx11::string::~string((string *)local_d8);
      }
    }
    std::__cxx11::to_string((string *)local_d8,(res->body)._M_string_length);
    Response::set_header(res,"Content-Length",(string *)local_d8);
LAB_0011d777:
    std::__cxx11::string::~string((string *)local_d8);
  }
  local_d8._24_8_ = local_d8 + 8;
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = 0;
  local_d8._16_8_ = 0;
  local_b0 = 0;
  local_b8 = (_Base_ptr)local_d8._24_8_;
  iVar4 = detail::write_headers<httplib::Response>(strm,res,(Headers *)local_d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_d8);
  if (iVar4 == 0) goto LAB_0011d838;
  bVar3 = std::operator!=(&req->method,"HEAD");
  if (bVar3) {
    if ((res->body)._M_string_length == 0) {
      if (((res->content_provider).super__Function_base._M_manager != (_Manager_type)0x0) &&
         (bVar3 = write_content_with_provider(local_a0,strm,req,res,&local_90,&local_70), !bVar3))
      goto LAB_0011d838;
    }
    else {
      iVar4 = (*strm->_vptr_Stream[5])(strm,local_a8);
      if (iVar4 == 0) {
LAB_0011d838:
        bVar3 = false;
        goto LAB_0011d83a;
      }
    }
  }
  bVar3 = true;
  if ((local_a0->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
              (&local_a0->logger_,req,res);
  }
LAB_0011d83a:
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return bVar3;
}

Assistant:

inline bool Server::write_response(Stream &strm, bool last_connection,
                                   const Request &req, Response &res) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_) { error_handler_(req, res); }

  // Response line
  if (!strm.write_format("HTTP/1.1 %d %s\r\n", res.status,
                         detail::status_message(res.status))) {
    return false;
  }

  // Headers
  if (last_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  }

  if (!last_connection && req.get_header_value("Connection") == "Keep-Alive") {
    res.set_header("Connection", "Keep-Alive");
  }

  if (!res.has_header("Content-Type")) {
    res.set_header("Content-Type", "text/plain");
  }

  if (!res.has_header("Accept-Ranges")) {
    res.set_header("Accept-Ranges", "bytes");
  }

  std::string content_type;
  std::string boundary;

  if (req.ranges.size() > 1) {
    boundary = detail::make_multipart_data_boundary();

    auto it = res.headers.find("Content-Type");
    if (it != res.headers.end()) {
      content_type = it->second;
      res.headers.erase(it);
    }

    res.headers.emplace("Content-Type",
                        "multipart/byteranges; boundary=" + boundary);
  }

  if (res.body.empty()) {
    if (res.content_length > 0) {
      size_t length = 0;
      if (req.ranges.empty()) {
        length = res.content_length;
      } else if (req.ranges.size() == 1) {
        auto offsets =
            detail::get_range_offset_and_length(req, res.content_length, 0);
        auto offset = offsets.first;
        length = offsets.second;
        auto content_range = detail::make_content_range_header_field(
            offset, length, res.content_length);
        res.set_header("Content-Range", content_range);
      } else {
        length = detail::get_multipart_ranges_data_length(req, res, boundary,
                                                          content_type);
      }
      res.set_header("Content-Length", std::to_string(length));
    } else {
      if (res.content_provider) {
        res.set_header("Transfer-Encoding", "chunked");
      } else {
        res.set_header("Content-Length", "0");
      }
    }
  } else {
    if (req.ranges.empty()) {
      ;
    } else if (req.ranges.size() == 1) {
      auto offsets =
          detail::get_range_offset_and_length(req, res.body.size(), 0);
      auto offset = offsets.first;
      auto length = offsets.second;
      auto content_range = detail::make_content_range_header_field(
          offset, length, res.body.size());
      res.set_header("Content-Range", content_range);
      res.body = res.body.substr(offset, length);
    } else {
      res.body =
          detail::make_multipart_ranges_data(req, res, boundary, content_type);
    }

#ifdef CPPHTTPLIB_ZLIB_SUPPORT
    // TODO: 'Accept-Encoding' has gzip, not gzip;q=0
    const auto &encodings = req.get_header_value("Accept-Encoding");
    if (encodings.find("gzip") != std::string::npos &&
        detail::can_compress(res.get_header_value("Content-Type"))) {
      if (detail::compress(res.body)) {
        res.set_header("Content-Encoding", "gzip");
      }
    }
#endif

    auto length = std::to_string(res.body.size());
    res.set_header("Content-Length", length);
  }

  if (!detail::write_headers(strm, res, Headers())) { return false; }

  // Body
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!strm.write(res.body)) { return false; }
    } else if (res.content_provider) {
      if (!write_content_with_provider(strm, req, res, boundary,
                                       content_type)) {
        return false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return true;
}